

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O3

IDisk * __thiscall Disk::CreateDisk(Disk *this,ILoadingProgress *loading_progress,ILog *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  IDisk *pIVar2;
  int iVar3;
  undefined8 *puVar4;
  IDisk *disk;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> list_item;
  TrackItem item;
  vector<SingleElements,_std::allocator<SingleElements>_> list_elements;
  IDisk *local_c0;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_b8;
  Disk *local_a0;
  ILoadingProgress *local_98;
  value_type local_90;
  undefined8 *local_60;
  undefined8 *local_58;
  long local_50;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_48;
  
  local_c0 = (IDisk *)0x0;
  local_a0 = this;
  local_98 = loading_progress;
  (*this->contained_element_->_vptr_IContainedElement[4])(&local_60,this->contained_element_,3);
  local_b8.super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_60 != local_58) {
    paVar1 = &local_90.path.field_2;
    puVar4 = local_60;
    do {
      local_90.path._M_string_length = 0;
      local_90.path.field_2._M_local_buf[0] = '\0';
      local_90.buffer = (uchar *)puVar4[1];
      local_90.size = (size_t)*(int *)(puVar4 + 2);
      __s = (char *)*puVar4;
      local_90.path._M_dataplus._M_p = (pointer)paVar1;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_90.path,0,(char *)0x0,(ulong)__s);
      std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::push_back
                (&local_b8,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.path._M_dataplus._M_p != paVar1) {
        operator_delete(local_90.path._M_dataplus._M_p,
                        CONCAT71(local_90.path.field_2._M_allocated_capacity._1_7_,
                                 local_90.path.field_2._M_local_buf[0]) + 1);
      }
      puVar4 = puVar4 + 3;
    } while (puVar4 != local_58);
  }
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
            (&local_48,&local_b8);
  iVar3 = DiskBuilder::LoadDisk(&local_a0->disk_builder_,&local_48,&local_c0,local_98);
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_48);
  if (iVar3 == 0) {
    IDisk::SetName(local_c0,(char *)*local_60);
  }
  pIVar2 = local_c0;
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_b8);
  if (local_60 != (undefined8 *)0x0) {
    operator_delete(local_60,local_50 - (long)local_60);
  }
  return pIVar2;
}

Assistant:

IDisk* Disk::CreateDisk(ILoadingProgress* loading_progress, ILog* log)
{
   IDisk* disk = nullptr;

   std::vector<SingleElements> list_elements = contained_element_->GetInnerElements(3);
   std::vector<FormatType::TrackItem> list_item;
   for (auto& list_element : list_elements)
   {
      FormatType::TrackItem item;
      item.buffer = list_element.buffer_;
      item.size = list_element.size_;
      item.path = list_element.filename_;
      list_item.push_back(item);
   }


   if (disk_builder_.LoadDisk(list_item, disk, loading_progress) == 0)
   {
      disk->SetName(list_elements[0].filename_);
   }
   return disk;
}